

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_BrepFace::SetDomain(ON_BrepFace *this,ON_Interval u_dom,ON_Interval v_dom)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ON_Interval new_interval;
  ON_Interval domain;
  ON_Interval new_interval_00;
  ON_Interval new_interval_01;
  ON_Interval domain_00;
  ON_Interval new_interval_02;
  ON_Interval old_interval;
  ON_Interval old_interval_00;
  ON_Interval old_interval_01;
  ON_Interval old_interval_02;
  ON_Interval domain_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ON_Surface *pS;
  ulong uVar5;
  undefined4 extraout_var;
  shared_ptr<const_ON_Mesh> *psVar6;
  ON_Interval *pOVar7;
  double *pdVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  ON_Xform *pOVar12;
  uint uVar13;
  ON_Xform *pOVar14;
  ON_Interval *this_01;
  long lVar15;
  byte bVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  double dVar17;
  ON_Interval v0_dom;
  ON_Interval u0_dom;
  array<std::shared_ptr<const_ON_Mesh>,_3UL> meshes;
  ON_Xform vx;
  ON_Interval dom1;
  ON_Interval local_280;
  ON_Interval local_270;
  ON_Interval local_260;
  ON_Interval local_250;
  double local_240;
  ON_Xform local_238;
  ON_Xform local_1b8;
  ON_Xform local_138;
  ON_Xform local_b0;
  
  local_280.m_t[1] = v_dom.m_t[1];
  local_280.m_t[0] = v_dom.m_t[0];
  dVar17 = u_dom.m_t[1];
  bVar16 = 0;
  local_270.m_t[0] = u_dom.m_t[0];
  if ((((this->m_brep != (ON_Brep *)0x0) &&
       (local_270.m_t[1] = dVar17, bVar3 = ON_Interval::IsIncreasing(&local_270), bVar3)) &&
      (bVar3 = ON_Interval::IsIncreasing(&local_280), bVar3)) &&
     (pS = SurfaceOf(this), pS != (ON_Surface *)0x0)) {
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
    local_250.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    local_250.m_t[1] = dVar17;
    (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
    local_260.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    local_260.m_t[1] = dVar17;
    bVar3 = ON_Interval::operator==(&local_250,&local_270);
    if ((bVar3) && (bVar3 = ON_Interval::operator==(&local_260,&local_280), bVar3)) {
      return true;
    }
    pOVar12 = &ON_Xform::IdentityTransformation;
    pOVar14 = &local_238;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    pOVar12 = &ON_Xform::IdentityTransformation;
    pOVar14 = &local_1b8;
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
      pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
    }
    bVar3 = ON_Interval::operator!=(&local_250,&local_270);
    if (((!bVar3) ||
        (old_interval_01.m_t[1] = local_250.m_t[1], old_interval_01.m_t[0] = local_250.m_t[0],
        new_interval_01.m_t[1] = local_270.m_t[1], new_interval_01.m_t[0] = local_270.m_t[0],
        dVar17 = local_250.m_t[1],
        bVar3 = ON_Xform::IntervalChange(&local_238,0,old_interval_01,new_interval_01), bVar3)) &&
       ((bVar3 = ON_Interval::operator!=(&local_260,&local_280), !bVar3 ||
        (old_interval.m_t[1] = local_260.m_t[1], old_interval.m_t[0] = local_260.m_t[0],
        new_interval.m_t[1] = local_280.m_t[1], new_interval.m_t[0] = local_280.m_t[0],
        dVar17 = local_260.m_t[1],
        bVar3 = ON_Xform::IntervalChange(&local_1b8,1,old_interval,new_interval), bVar3)))) {
      ON_Xform::operator*(&local_138,&local_238,&local_1b8);
      pOVar12 = &local_138;
      pOVar14 = &local_b0;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      (*(this->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object.
        _vptr_ON_Object[0x17])(this,1);
      uVar5 = (ulong)(this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                     super_ON_ClassArray<ON_BrepFace>.m_count;
      if (0 < (long)uVar5) {
        piVar10 = &((this->m_brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                    super_ON_ClassArray<ON_BrepFace>.m_a)->m_si;
        uVar13 = 0;
        uVar11 = 1;
        do {
          uVar13 = (*piVar10 == this->m_si) + uVar13;
          if (uVar5 <= uVar11) break;
          uVar11 = uVar11 + 1;
          piVar10 = piVar10 + 0x36;
        } while (uVar13 < 2);
        if (1 < uVar13) {
          iVar4 = (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])(pS);
          pS = (ON_Surface *)CONCAT44(extraout_var,iVar4);
          iVar4 = ON_Brep::AddSurface(this->m_brep,pS);
          this->m_si = iVar4;
          ON_SurfaceProxy::SetProxySurface(&this->super_ON_SurfaceProxy,pS);
        }
      }
      bVar3 = ON_Interval::operator!=(&local_270,&local_250);
      if ((bVar3) &&
         (domain_00.m_t[1] = local_270.m_t[1], domain_00.m_t[0] = local_270.m_t[0],
         dVar17 = local_270.m_t[1], bVar3 = ON_Surface::SetDomain(pS,0,domain_00), !bVar3)) {
        return false;
      }
      bVar3 = ON_Interval::operator!=(&local_280,&local_260);
      if ((bVar3) &&
         (domain.m_t[1] = local_280.m_t[1], domain.m_t[0] = local_280.m_t[0],
         dVar17 = local_280.m_t[1], bVar3 = ON_Surface::SetDomain(pS,1,domain), !bVar3)) {
        domain_01.m_t[1] = local_250.m_t[1];
        domain_01.m_t[0] = local_250.m_t[0];
        ON_Surface::SetDomain(pS,0,domain_01);
        return false;
      }
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,0);
      local_270.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      local_270.m_t[1] = dVar17;
      (*(pS->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pS,1);
      local_280.m_t[0] = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      pOVar12 = &ON_Xform::IdentityTransformation;
      pOVar14 = &local_238;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      pOVar12 = &ON_Xform::IdentityTransformation;
      pOVar14 = &local_1b8;
      for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
        pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
        pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
        pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      local_280.m_t[1] = dVar17;
      bVar3 = ON_Interval::operator!=(&local_250,&local_270);
      if (((!bVar3) ||
          (old_interval_02.m_t[1] = local_250.m_t[1], old_interval_02.m_t[0] = local_250.m_t[0],
          new_interval_02.m_t[1] = local_270.m_t[1], new_interval_02.m_t[0] = local_270.m_t[0],
          bVar3 = ON_Xform::IntervalChange(&local_238,0,old_interval_02,new_interval_02), bVar3)) &&
         ((bVar3 = ON_Interval::operator!=(&local_260,&local_280), !bVar3 ||
          (old_interval_00.m_t[1] = local_260.m_t[1], old_interval_00.m_t[0] = local_260.m_t[0],
          new_interval_00.m_t[1] = local_280.m_t[1], new_interval_00.m_t[0] = local_280.m_t[0],
          bVar3 = ON_Xform::IntervalChange(&local_1b8,1,old_interval_00,new_interval_00), bVar3))))
      {
        ON_Xform::operator*(&local_138,&local_238,&local_1b8);
        pOVar12 = &local_138;
        pOVar14 = &local_b0;
        for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
          pOVar14->m_xform[0][0] = pOVar12->m_xform[0][0];
          pOVar12 = (ON_Xform *)((long)pOVar12 + ((ulong)bVar16 * -2 + 1) * 8);
          pOVar14 = (ON_Xform *)((long)pOVar14 + ((ulong)bVar16 * -2 + 1) * 8);
        }
        bVar3 = TransformTrim(this,&local_b0);
        if (bVar3) {
          psVar6 = UniqueMesh(this,analysis_mesh);
          local_238.m_xform[0][0] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[0][1] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][1])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][1])->_M_use_count + 1;
            }
          }
          psVar6 = UniqueMesh(this,render_mesh);
          local_238.m_xform[0][2] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[0][3] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][3])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[0][3])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[0][3])->_M_use_count + 1;
            }
          }
          psVar6 = UniqueMesh(this,preview_mesh);
          local_238.m_xform[1][0] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
          local_238.m_xform[1][1] =
               (double)(psVar6->super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[1][1])->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.m_xform[1][1])->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.m_xform[1][1])->_M_use_count + 1;
            }
          }
          lVar9 = 0;
          do {
            lVar1 = *(long *)((long)local_238.m_xform[0] + lVar9);
            if (lVar1 != 0) {
              lVar15 = 0;
              bVar3 = true;
              do {
                bVar2 = bVar3;
                this_01 = (ON_Interval *)(lVar15 * 0x10 + lVar1 + 0x240);
                pOVar7 = &local_260;
                if (bVar2) {
                  pOVar7 = &local_250;
                }
                local_1b8.m_xform[0][0] = pOVar7->m_t[0];
                local_1b8.m_xform[0][1] = pOVar7->m_t[1];
                pOVar7 = &local_280;
                if (bVar2) {
                  pOVar7 = &local_270;
                }
                local_138.m_xform[0][0] = pOVar7->m_t[0];
                local_138.m_xform[0][1] = pOVar7->m_t[1];
                bVar3 = ON_Interval::IsIncreasing(this_01);
                if ((bVar3) &&
                   (bVar3 = ON_Interval::operator!=
                                      ((ON_Interval *)&local_1b8,(ON_Interval *)&local_138), bVar3))
                {
                  bVar3 = ON_Interval::operator==(this_01,(ON_Interval *)&local_1b8);
                  if (bVar3) {
                    this_01->m_t[0] = local_138.m_xform[0][0];
                    this_01->m_t[1] = local_138.m_xform[0][1];
                  }
                  else {
                    pdVar8 = ON_Interval::operator[](this_01,0);
                    dVar17 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_1b8,*pdVar8);
                    local_240 = ON_Interval::ParameterAt((ON_Interval *)&local_138,dVar17);
                    pdVar8 = ON_Interval::operator[](this_01,1);
                    dVar17 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_1b8,*pdVar8);
                    dVar17 = ON_Interval::ParameterAt((ON_Interval *)&local_138,dVar17);
                    ON_Interval::Set(this_01,local_240,dVar17);
                  }
                }
                lVar15 = 1;
                bVar3 = false;
              } while (bVar2);
            }
            lVar9 = lVar9 + 0x10;
          } while (lVar9 != 0x30);
          lVar9 = 0x30;
          do {
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)(local_238.m_xform + -1) + 0x18 + lVar9);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_BrepFace::SetDomain(
       ON_Interval u_dom,
       ON_Interval v_dom
       )
{
  if ( 0 == m_brep )
    return false;
  if ( !u_dom.IsIncreasing() )
    return false;
  if ( !v_dom.IsIncreasing() )
    return false;
  
  ON_Surface* srf = const_cast<ON_Surface*>(SurfaceOf());
  if ( 0 == srf )
    return false;

  ON_Interval u0_dom = srf->Domain(0);
  ON_Interval v0_dom = srf->Domain(1);
  if ( u0_dom == u_dom && v0_dom == v_dom )
    return true;

  ON_Xform xform(ON_Xform::IdentityTransformation);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

// 2/18/03 GBA.  Destroy cache on the face.
	DestroyRuntimeCache(true);

  if ( m_brep->SurfaceUseCount( m_si, 2 ) > 1 )
  {
    srf = srf->DuplicateSurface();
    m_si = m_brep->AddSurface(srf);
    SetProxySurface(srf);
  }

  if ( u_dom != u0_dom )
  {
    if ( !srf->SetDomain( 0, u_dom ) )
      return false;
  }

  if ( v_dom != v0_dom )
  {
    if ( !srf->SetDomain( 1, v_dom ) )
    {
      srf->SetDomain(0,u0_dom );
      return false;
    }
  }

  // just to be sure 2d curves are in synch with actual surface
  // domain in case srf->SetDomain() does something weird.
  u_dom = srf->Domain(0);
  v_dom = srf->Domain(1);
  {
    ON_Xform ux(ON_Xform::IdentityTransformation), vx(ON_Xform::IdentityTransformation);
    if ( u0_dom != u_dom )
    {
      if ( !ux.IntervalChange(0,u0_dom,u_dom) )
        return false;
    }
    if ( v0_dom != v_dom )
    {
      if ( !vx.IntervalChange(1,v0_dom,v_dom) )
        return false;
    }
    xform = ux*vx;
  }

  if ( !TransformTrim(xform) )
    return false;

  std::array<std::shared_ptr<const ON_Mesh>, 3> meshes { UniqueMesh(ON::analysis_mesh),  UniqueMesh(ON::render_mesh),  UniqueMesh(ON::preview_mesh) };

  for (auto& m : meshes)
  {
    if (m)
    {
      auto pMesh = const_cast<ON_Mesh*>(m.get());
      for ( int dir = 0; dir < 2; dir++ )
      {
        ON_Interval& mdom = pMesh->m_srf_domain[dir];

        const ON_Interval dom0 = dir ? v0_dom : u0_dom;
        const ON_Interval dom1 = dir ? v_dom : u_dom;

        if ( mdom.IsIncreasing() && dom0 != dom1 )
        {
          if ( mdom == dom0 )
          {
            mdom = dom1;
          }
          else
          {
            double t0 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[0]));
            double t1 = dom1.ParameterAt(dom0.NormalizedParameterAt(mdom[1]));
            mdom.Set(t0,t1);
          }
        }
      }
    }
  }

  return true;
}